

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  _Head_base<0UL,_CB_ADF::cb_adf_*,_false> _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  option_group_definition *poVar5;
  ostream *poVar6;
  base_learner *l;
  multi_learner *base;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  size_t sVar11;
  byte bVar12;
  size_t ws;
  byte bVar13;
  bool cb_adf_option;
  allocator local_6c0;
  allocator local_6bf;
  allocator local_6be;
  allocator local_6bd;
  allocator local_6bc;
  allocator local_6bb;
  allocator local_6ba;
  allocator local_6b9;
  free_ptr<CB_ADF::cb_adf> ld;
  undefined1 local_6a8 [112];
  bool local_638;
  string type_string;
  string local_5e8 [32];
  string local_5c8 [32];
  undefined1 local_5a8 [160];
  string local_508 [32];
  string local_4e8;
  string local_4c8 [32];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  option_group_definition new_options;
  undefined1 local_3f0 [112];
  bool local_380;
  undefined1 local_350 [112];
  bool local_2e0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  bVar13 = 0;
  scoped_calloc_or_throw<CB_ADF::cb_adf>();
  cb_adf_option = false;
  std::__cxx11::string::string((string *)&type_string,"ips",(allocator *)local_6a8);
  std::__cxx11::string::string
            ((string *)&local_448,"Contextual Bandit with Action Dependent Features",
             (allocator *)local_6a8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string((string *)&local_468,"cb_adf",&local_6b9);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6a8,&local_468,&cb_adf_option);
  local_638 = true;
  std::__cxx11::string::string
            (local_5c8,"Do Contextual Bandit learning with multiline action dependent features.",
             &local_6ba);
  std::__cxx11::string::_M_assign((string *)(local_6a8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_6a8);
  poVar5 = VW::config::option_group_definition::add<bool>(&new_options,&local_d0);
  std::__cxx11::string::string((string *)&local_488,"rank_all",&local_6bb);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_488,
             &(ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->rank_all);
  local_380 = true;
  std::__cxx11::string::string(local_5e8,"Return actions sorted by score order",&local_6bc);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_3f0);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_170);
  std::__cxx11::string::string((string *)&local_4a8,"no_predict",&local_6bd);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5a8,&local_4a8,
             &(ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->no_predict);
  std::__cxx11::string::string(local_4c8,"Do not do a prediction when training",&local_6be);
  std::__cxx11::string::_M_assign((string *)(local_5a8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_5a8);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_210);
  std::__cxx11::string::string((string *)&local_4e8,"cb_type",&local_6bf);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350,&local_4e8,&type_string);
  local_2e0 = true;
  std::__cxx11::string::string
            (local_508,"contextual bandit method to use in {ips,dm,dr, mtr}",&local_6c0);
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar5,&local_2b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_508);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_350);
  std::__cxx11::string::~string((string *)&local_4e8);
  VW::config::typed_option<bool>::~typed_option(&local_210);
  std::__cxx11::string::~string(local_4c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  VW::config::typed_option<bool>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_5e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3f0);
  std::__cxx11::string::~string((string *)&local_488);
  VW::config::typed_option<bool>::~typed_option(&local_d0);
  std::__cxx11::string::~string(local_5c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_6a8);
  std::__cxx11::string::~string((string *)&local_468);
  (**options->_vptr_options_i)(options,&new_options);
  if (cb_adf_option == false) {
    plVar7 = (learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_0020f98f;
  }
  std::__cxx11::string::string((string *)local_6a8,"cb_type",(allocator *)local_3f0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_6a8);
  std::__cxx11::string::~string((string *)local_6a8);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_6a8,"cb_type",(allocator *)local_3f0);
    (*options->_vptr_options_i[5])(options,local_6a8,&type_string);
    std::__cxx11::string::~string((string *)local_6a8);
    (**options->_vptr_options_i)(options,&new_options);
  }
  (ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->all = all;
  iVar2 = std::__cxx11::string::compare((char *)&type_string);
  if (iVar2 == 0) {
    ws = 2;
    sVar11 = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&type_string);
    ws = 1;
    sVar11 = 2;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&type_string);
      if (iVar3 == 0) {
        sVar11 = 3;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&type_string);
        ws = 1;
        sVar11 = ws;
        if (iVar3 != 0) {
          poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                                   "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\'}; resetting to ips."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          sVar11 = 2;
        }
      }
    }
  }
  ((ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->gen_cs).cb_type = sVar11;
  all->delete_prediction = ACTION_SCORE::delete_action_scores;
  std::__cxx11::string::string((string *)local_6a8,"csoaa_ldf",(allocator *)local_350);
  iVar3 = (*options->_vptr_options_i[1])(options,local_6a8);
  if ((char)iVar3 == '\0') {
    std::__cxx11::string::string((string *)local_3f0,"wap_ldf",(allocator *)local_5c8);
    iVar4 = (*options->_vptr_options_i[1])(options,local_3f0);
    bVar12 = 1;
    if (((char)iVar4 != '\0') &&
       ((ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->rank_all == false))
    goto LAB_0020f697;
LAB_0020f6dd:
    std::__cxx11::string::~string((string *)local_3f0);
LAB_0020f6ea:
    std::__cxx11::string::~string((string *)local_6a8);
    if (bVar12 != 0) goto LAB_0020f6fd;
  }
  else {
    if ((ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->rank_all == false) {
LAB_0020f697:
      std::__cxx11::string::string((string *)local_5a8,"csoaa_rank",(allocator *)local_5e8);
      iVar4 = (*options->_vptr_options_i[1])(options,local_5a8);
      bVar12 = (byte)iVar4 ^ 1;
      std::__cxx11::string::~string((string *)local_5a8);
      if ((char)iVar3 == '\0') goto LAB_0020f6dd;
      goto LAB_0020f6ea;
    }
    std::__cxx11::string::~string((string *)local_6a8);
LAB_0020f6fd:
    std::__cxx11::string::string((string *)local_6a8,"csoaa_ldf",(allocator *)local_5a8);
    iVar3 = (*options->_vptr_options_i[1])(options,local_6a8);
    std::__cxx11::string::~string((string *)local_6a8);
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string((string *)local_6a8,"csoaa_ldf",(allocator *)local_350);
      std::__cxx11::string::string((string *)local_5a8,"multiline",(allocator *)local_5e8);
      (*options->_vptr_options_i[5])(options,local_6a8,local_5a8);
      std::__cxx11::string::~string((string *)local_5a8);
      std::__cxx11::string::~string((string *)local_6a8);
    }
    std::__cxx11::string::string((string *)local_6a8,"csoaa_rank",(allocator *)local_5a8);
    iVar3 = (*options->_vptr_options_i[1])(options,local_6a8);
    std::__cxx11::string::~string((string *)local_6a8);
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string((string *)local_6a8,"csoaa_rank",(allocator *)local_350);
      std::__cxx11::string::string((string *)local_5a8,"",(allocator *)local_5e8);
      (*options->_vptr_options_i[5])(options,local_6a8,local_5a8);
      std::__cxx11::string::~string((string *)local_5a8);
      std::__cxx11::string::~string((string *)local_6a8);
    }
  }
  std::__cxx11::string::string((string *)local_6a8,"baseline",(allocator *)local_5a8);
  iVar3 = (*options->_vptr_options_i[1])(options,local_6a8);
  std::__cxx11::string::~string((string *)local_6a8);
  if ((char)iVar3 == '\x01' && iVar2 == 0) {
    std::__cxx11::string::string((string *)local_6a8,"check_enabled",(allocator *)local_350);
    std::__cxx11::string::string((string *)local_5a8,"",(allocator *)local_5e8);
    (*options->_vptr_options_i[5])(options,local_6a8,local_5a8);
    std::__cxx11::string::~string((string *)local_5a8);
    std::__cxx11::string::~string((string *)local_6a8);
  }
  l = setup_base(options,all);
  base = LEARNER::as_multiline<char,char>(l);
  _Var1 = ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>;
  ppuVar9 = &CB::cb_label;
  plVar10 = &all->p->lp;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
    ppuVar9 = ppuVar9 + (ulong)bVar13 * -2 + 1;
    plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar13 * -0x10 + 8);
  }
  all->label_type = cb;
  plVar7 = LEARNER::learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl,base,
                      CB_ADF::do_actual_learning<true>,CB_ADF::do_actual_learning<false>,ws,
                      action_scores);
  ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl = (cb_adf *)0x0;
  *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
  *(code **)(plVar7 + 0x68) = CB_ADF::finish_multiline_example;
  ((_Var1._M_head_impl)->gen_cs).scorer = all->scorer;
  *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
  *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
  *(code **)(plVar7 + 200) = CB_ADF::finish;
  *(code **)(plVar7 + 0x80) = CB_ADF::save_load;
  *(undefined8 *)(plVar7 + 0x70) = *(undefined8 *)(plVar7 + 0x18);
  *(undefined8 *)(plVar7 + 0x78) = *(undefined8 *)(plVar7 + 0x20);
LAB_0020f98f:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::~unique_ptr(&ld);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "ips";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr, mtr}"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm'}; resetting to ips." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}